

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_sockets.c
# Opt level: O1

int net_would_block(mbedtls_net_context *ctx)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  uVar2 = fcntl(ctx->fd,3);
  *piVar3 = iVar1;
  return (int)(iVar1 == 0xb & (byte)(uVar2 >> 0xb));
}

Assistant:

static int net_would_block( const mbedtls_net_context *ctx )
{
    int err = errno;

    /*
     * Never return 'WOULD BLOCK' on a non-blocking socket
     */
    if( ( fcntl( ctx->fd, F_GETFL ) & O_NONBLOCK ) != O_NONBLOCK )
    {
        errno = err;
        return( 0 );
    }

    switch( errno = err )
    {
#if defined EAGAIN
        case EAGAIN:
#endif
#if defined EWOULDBLOCK && EWOULDBLOCK != EAGAIN
        case EWOULDBLOCK:
#endif
            return( 1 );
    }
    return( 0 );
}